

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O3

void * SuiteSparse_malloc(size_t nitems,size_t size_of_item)

{
  long lVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  
  lVar4 = nitems + (nitems == 0);
  lVar1 = size_of_item + (size_of_item == 0);
  sVar2 = lVar1 * lVar4;
  auVar7._8_4_ = (int)(sVar2 >> 0x20);
  auVar7._0_8_ = sVar2;
  auVar7._12_4_ = 0x45300000;
  dVar9 = (auVar7._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar8._0_8_ = lVar4;
  auVar8._12_4_ = 0x45300000;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
  if ((dVar6 == dVar9) && (!NAN(dVar6) && !NAN(dVar9))) {
    pvVar3 = (*SuiteSparse_config.malloc_func)(sVar2);
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

void *SuiteSparse_malloc    /* pointer to allocated block of memory */
(
    size_t nitems,          /* number of items to malloc */
    size_t size_of_item     /* sizeof each item */
)
{
    void *p ;
    size_t size ;
    if (nitems < 1) nitems = 1 ;
    if (size_of_item < 1) size_of_item = 1 ;
    size = nitems * size_of_item  ;

    if (size != ((c_float) nitems) * size_of_item)
    {
        /* size_t overflow */
        p = NULL ;
    }
    else
    {
        p = (void *) (SuiteSparse_config.malloc_func) (size) ;
        // p = (void *) c_malloc(size) ;
    }
    return (p) ;
}